

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O0

int __thiscall HydEngine::timeToCloseTank(HydEngine *this,int tstep)

{
  bool bVar1;
  int iVar2;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  reference ppNVar3;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [36];
  int local_4c;
  Tank *pTStack_48;
  int t;
  Tank *tank;
  Node *node;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  Tank *closedTank;
  int tstep_local;
  HydEngine *this_local;
  
  __range1 = (vector<Node_*,_std::allocator<Node_*>_> *)0x0;
  this_00 = &this->network->nodes;
  __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(this_00);
  node = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(this_00);
  closedTank._4_4_ = tstep;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                     *)&node), bVar1) {
    ppNVar3 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&__end1);
    tank = (Tank *)*ppNVar3;
    iVar2 = (*(tank->super_Node).super_Element._vptr_Element[2])();
    if (iVar2 == 1) {
      pTStack_48 = tank;
      local_4c = Tank::timeToVolume(tank,tank->minVolume);
      if (local_4c < 1) {
        local_4c = Tank::timeToVolume(pTStack_48,pTStack_48->maxVolume);
      }
      if ((0 < local_4c) && (local_4c < closedTank._4_4_)) {
        closedTank._4_4_ = local_4c;
        __range1 = (vector<Node_*,_std::allocator<Node_*>_> *)pTStack_48;
      }
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end1);
  }
  if (__range1 != (vector<Node_*,_std::allocator<Node_*>_> *)0x0) {
    std::operator+((char *)local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"  (Tank ");
    std::operator+(local_70,(char *)local_90);
    std::__cxx11::string::operator=((string *)&this->timeStepReason,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_90);
  }
  return closedTank._4_4_;
}

Assistant:

int HydEngine::timeToCloseTank(int tstep)
{
    Tank* closedTank = nullptr;
    for (Node* node : network->nodes)
    {
        // ... check if node is a tank

        if ( node->type() == Node::TANK )
        {
            // ... find the time to fill (or empty) the tank

            Tank* tank = static_cast<Tank*>(node);
            int t = tank->timeToVolume(tank->minVolume);
            if ( t <= 0 ) t = tank->timeToVolume(tank->maxVolume);

            // ... compare this time with current time step

            if ( t > 0 && t < tstep )
            {
                tstep = t;
                closedTank = tank;
            }
        }
    }
    if ( closedTank )
    {
        timeStepReason = "  (Tank " + closedTank->name + " closed)";
    }
    return tstep;
}